

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int parse_record_header(st_ptls_record_t *rec,uint8_t *src)

{
  uint16_t uVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  int local_4;
  
  *in_RDI = *in_RSI;
  uVar1 = ntoh16((uint8_t *)(in_RSI + 1));
  *(uint16_t *)(in_RDI + 2) = uVar1;
  uVar1 = ntoh16((uint8_t *)(in_RSI + 3));
  *(ulong *)(in_RDI + 8) = (ulong)uVar1;
  iVar2 = 0x4000;
  if (*in_RDI == '\x17') {
    iVar2 = 0x4100;
  }
  if ((ulong)(long)iVar2 < *(ulong *)(in_RDI + 8)) {
    local_4 = 0x32;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int parse_record_header(struct st_ptls_record_t *rec, const uint8_t *src)
{
    rec->type = src[0];
    rec->version = ntoh16(src + 1);
    rec->length = ntoh16(src + 3);

    if (rec->length >
        (size_t)(rec->type == PTLS_CONTENT_TYPE_APPDATA ? PTLS_MAX_ENCRYPTED_RECORD_SIZE : PTLS_MAX_PLAINTEXT_RECORD_SIZE))
        return PTLS_ALERT_DECODE_ERROR;

    return 0;
}